

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_logisim.cpp
# Opt level: O2

bool lsim::load_logisim(LSimContext *lsim_context,char *data,size_t len)

{
  bool bVar1;
  xml_parse_result result;
  xml_document xml_doc;
  LogisimParser parser;
  
  pugi::xml_document::xml_document(&xml_doc);
  pugi::xml_document::load_buffer(&result,&xml_doc,data,len,0x74,encoding_auto);
  bVar1 = pugi::xml_parse_result::operator_cast_to_bool(&result);
  if (bVar1) {
    anon_unknown.dwarf_1bdfec::LogisimParser::LogisimParser(&parser,&xml_doc,lsim_context);
    bVar1 = anon_unknown.dwarf_1bdfec::LogisimParser::parse_xml(&parser);
    anon_unknown.dwarf_1bdfec::LogisimParser::~LogisimParser(&parser);
  }
  else {
    bVar1 = false;
  }
  pugi::xml_document::~xml_document(&xml_doc);
  return bVar1;
}

Assistant:

bool load_logisim(LSimContext *lsim_context, const char *data, size_t len) {
    pugi::xml_document xml_doc;

    auto result = xml_doc.load_buffer(data, len);
    if (!result) {
        return false;
    }

    auto parser = LogisimParser(&xml_doc, lsim_context);
    return parser.parse_xml();
}